

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_test.cpp
# Opt level: O1

void addGlobal(void)

{
  int iVar1;
  int iVar2;
  LockGuard lock;
  LockGuard LStack_28;
  
  iVar2 = 200;
  do {
    LockGuard::LockGuard(&LStack_28,&mutex);
    iVar1 = globalVal;
    usleep(1);
    globalVal = iVar1 + 1;
    LockGuard::~LockGuard(&LStack_28);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void addGlobal()
{
	int i = 0;
	while(i < 200)
	{
		LockGuard lock(mutex);
		int val = globalVal;
		val += 1;
		usleep(1);
		globalVal = val;
		++i;
	}
}